

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O2

QString * __thiscall
QFSFileEngine::fileName(QString *__return_storage_ptr__,QFSFileEngine *this,FileName file)

{
  QFSFileEnginePrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QFileSystemEntry entry;
  undefined1 local_58 [56];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFSFileEnginePrivate *)(this->super_QAbstractFileEngine).d_ptr.d;
  switch(file) {
  case BaseName:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QFileSystemEntry::fileName(__return_storage_ptr__,&this_00->fileEntry);
      return __return_storage_ptr__;
    }
    break;
  case PathName:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QFileSystemEntry::path(__return_storage_ptr__,&this_00->fileEntry);
      return __return_storage_ptr__;
    }
    break;
  case AbsoluteName:
  case AbsolutePathName:
    local_58._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEngine::absoluteName((QFileSystemEntry *)local_58,&this_00->fileEntry);
    if (file == AbsolutePathName) goto LAB_0012c1f6;
LAB_0012c23c:
    QFileSystemEntry::filePath(__return_storage_ptr__,(QFileSystemEntry *)local_58);
    goto LAB_0012c244;
  case AbsoluteLinkTarget:
    bVar1 = QFSFileEnginePrivate::isSymlink(this_00);
    if (bVar1) {
      local_58._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QFileSystemEngine::getLinkTarget
                ((QFileSystemEntry *)local_58,&this_00->fileEntry,&this_00->metaData);
LAB_0012c345:
      QFileSystemEntry::filePath(__return_storage_ptr__,(QFileSystemEntry *)local_58);
      goto LAB_0012c244;
    }
  case BundleName:
  case JunctionName:
switchD_0012c1b8_caseD_8:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    break;
  case CanonicalName:
  case CanonicalPathName:
    local_58._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEngine::canonicalName
              ((QFileSystemEntry *)local_58,&this_00->fileEntry,&this_00->metaData);
    if (file != CanonicalPathName) goto LAB_0012c23c;
LAB_0012c1f6:
    QFileSystemEntry::path(__return_storage_ptr__,(QFileSystemEntry *)local_58);
LAB_0012c244:
    QFileSystemEntry::~QFileSystemEntry((QFileSystemEntry *)local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
    break;
  case RawLinkPath:
    bVar1 = QFSFileEnginePrivate::isSymlink(this_00);
    if (bVar1) {
      local_58._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QFileSystemEngine::getRawLinkPath
                ((QFileSystemEntry *)local_58,&this_00->fileEntry,&this_00->metaData);
      goto LAB_0012c345;
    }
    goto switchD_0012c1b8_caseD_8;
  default:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QFileSystemEntry::filePath(__return_storage_ptr__,&this_00->fileEntry);
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QFSFileEngine::fileName(FileName file) const
{
    Q_D(const QFSFileEngine);
    switch (file) {
    case BundleName:
        return QFileSystemEngine::bundleName(d->fileEntry);
    case BaseName:
        return d->fileEntry.fileName();
    case PathName:
        return d->fileEntry.path();
    case AbsoluteName:
    case AbsolutePathName: {
        QFileSystemEntry entry(QFileSystemEngine::absoluteName(d->fileEntry));
        return file == AbsolutePathName ? entry.path() : entry.filePath();
    }
    case CanonicalName:
    case CanonicalPathName: {
        QFileSystemEntry entry(QFileSystemEngine::canonicalName(d->fileEntry, d->metaData));
        return file == CanonicalPathName ? entry.path() : entry.filePath();
    }
    case AbsoluteLinkTarget:
        if (d->isSymlink()) {
            QFileSystemEntry entry = QFileSystemEngine::getLinkTarget(d->fileEntry, d->metaData);
            return entry.filePath();
        }
        return QString();
    case RawLinkPath:
        if (d->isSymlink()) {
            QFileSystemEntry entry = QFileSystemEngine::getRawLinkPath(d->fileEntry, d->metaData);
            return entry.filePath();
        }
        return QString();
    case JunctionName:
        return QString();
    case DefaultName:
    case NFileNames:
        break;
    }
    return d->fileEntry.filePath();
}